

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_line_ex(rf_vec2 start_pos,rf_vec2 end_pos,float thick,rf_color color)

{
  float fVar1;
  int iVar2;
  int iVar3;
  rf_render_batch *prVar4;
  long lVar5;
  rf_vertex_buffer *prVar6;
  rf_gfx_texcoord_data_type *prVar7;
  rf_context *prVar8;
  float fVar9;
  float fVar10;
  
  fVar9 = start_pos.x;
  fVar10 = start_pos.y;
  if (fVar9 <= end_pos.x) {
    fVar9 = end_pos.x;
    fVar10 = end_pos.y;
    end_pos = start_pos;
  }
  fVar9 = fVar9 - end_pos.x;
  fVar10 = fVar10 - end_pos.y;
  fVar9 = fVar9 * fVar9 + fVar10 * fVar10;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  fVar10 = asinf(fVar10 / fVar9);
  prVar8 = rf__ctx;
  if ((rf__ctx->field_0).tex_shapes.id == 0) {
    (rf__ctx->field_0).tex_shapes.id = (rf__ctx->field_0).default_texture_id;
    (prVar8->field_0).tex_shapes.width = 1;
    (prVar8->field_0).tex_shapes.height = 1;
    (prVar8->field_0).tex_shapes.mipmaps = 1;
    (prVar8->field_0).tex_shapes.format = RF_UNCOMPRESSED_R8G8B8A8;
    *(undefined4 *)&(prVar8->field_0).tex_shapes.valid = 0;
    (prVar8->field_0).rec_tex_shapes.x = 0.0;
    (prVar8->field_0).rec_tex_shapes.y = 0.0;
    (prVar8->field_0).rec_tex_shapes.width = 1.0;
    (prVar8->field_0).rec_tex_shapes.height = 1.0;
  }
  rf_gfx_enable_texture((prVar8->field_0).tex_shapes.id);
  rf_gfx_push_matrix();
  rf_gfx_translatef(end_pos.x,end_pos.y,0.0);
  rf_gfx_rotatef(fVar10 * 57.295776,0.0,0.0,1.0);
  rf_gfx_translatef(0.0,(float)(~-(uint)(1.0 < thick) & 0xbf800000 |
                               (uint)(thick * -0.5) & -(uint)(1.0 < thick)),0.0);
  rf_gfx_begin(RF_QUADS);
  rf_gfx_color4ub(color.r,color.g,color.b,color.a);
  fVar10 = (rf__ctx->field_0).rec_tex_shapes.y;
  iVar2 = (rf__ctx->field_0).tex_shapes.height;
  prVar4 = (rf__ctx->field_0).current_batch;
  lVar5 = prVar4->current_buffer;
  prVar6 = prVar4->vertex_buffers;
  prVar7 = prVar6[lVar5].texcoords;
  iVar3 = prVar6[lVar5].tc_counter;
  prVar7[(long)iVar3 * 2] =
       (rf__ctx->field_0).rec_tex_shapes.x / (float)(rf__ctx->field_0).tex_shapes.width;
  prVar7[iVar3 * 2 + 1] = fVar10 / (float)iVar2;
  prVar6[lVar5].tc_counter = prVar6[lVar5].tc_counter + 1;
  rf_gfx_vertex3f(0.0,0.0,prVar4->current_depth);
  fVar10 = (rf__ctx->field_0).rec_tex_shapes.y;
  fVar1 = (rf__ctx->field_0).rec_tex_shapes.height;
  iVar2 = (rf__ctx->field_0).tex_shapes.height;
  prVar4 = (rf__ctx->field_0).current_batch;
  lVar5 = prVar4->current_buffer;
  prVar6 = prVar4->vertex_buffers;
  prVar7 = prVar6[lVar5].texcoords;
  iVar3 = prVar6[lVar5].tc_counter;
  prVar7[(long)iVar3 * 2] =
       (rf__ctx->field_0).rec_tex_shapes.x / (float)(rf__ctx->field_0).tex_shapes.width;
  prVar7[iVar3 * 2 + 1] = (fVar10 + fVar1) / (float)iVar2;
  prVar6[lVar5].tc_counter = prVar6[lVar5].tc_counter + 1;
  rf_gfx_vertex3f(0.0,thick,prVar4->current_depth);
  fVar10 = (rf__ctx->field_0).rec_tex_shapes.y;
  fVar1 = (rf__ctx->field_0).rec_tex_shapes.height;
  iVar2 = (rf__ctx->field_0).tex_shapes.height;
  prVar4 = (rf__ctx->field_0).current_batch;
  lVar5 = prVar4->current_buffer;
  prVar6 = prVar4->vertex_buffers;
  prVar7 = prVar6[lVar5].texcoords;
  iVar3 = prVar6[lVar5].tc_counter;
  prVar7[(long)iVar3 * 2] =
       ((rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width) /
       (float)(rf__ctx->field_0).tex_shapes.width;
  prVar7[iVar3 * 2 + 1] = (fVar10 + fVar1) / (float)iVar2;
  prVar6[lVar5].tc_counter = prVar6[lVar5].tc_counter + 1;
  rf_gfx_vertex3f(fVar9,thick,prVar4->current_depth);
  fVar10 = (rf__ctx->field_0).rec_tex_shapes.y;
  iVar2 = (rf__ctx->field_0).tex_shapes.height;
  prVar4 = (rf__ctx->field_0).current_batch;
  lVar5 = prVar4->current_buffer;
  prVar6 = prVar4->vertex_buffers;
  prVar7 = prVar6[lVar5].texcoords;
  iVar3 = prVar6[lVar5].tc_counter;
  prVar7[(long)iVar3 * 2] =
       ((rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width) /
       (float)(rf__ctx->field_0).tex_shapes.width;
  prVar7[iVar3 * 2 + 1] = fVar10 / (float)iVar2;
  prVar6[lVar5].tc_counter = prVar6[lVar5].tc_counter + 1;
  rf_gfx_vertex3f(fVar9,0.0,prVar4->current_depth);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_line_ex(rf_vec2 start_pos, rf_vec2 end_pos, float thick, rf_color color)
{
    if (start_pos.x > end_pos.x)
    {
        rf_vec2 temp_pos = start_pos;
        start_pos = end_pos;
        end_pos = temp_pos;
    }

    float dx = end_pos.x - start_pos.x;
    float dy = end_pos.y - start_pos.y;

    float d = sqrtf(dx*dx + dy*dy);
    float angle = asinf(dy/d);

    rf_gfx_enable_texture(rf_get_shapes_texture().id);

    rf_gfx_push_matrix();
    rf_gfx_translatef((float)start_pos.x, (float)start_pos.y, 0.0f);
    rf_gfx_rotatef(RF_RAD2DEG * angle, 0.0f, 0.0f, 1.0f);
    rf_gfx_translatef(0, (thick > 1.0f)? -thick/2.0f : -1.0f, 0.0f);

    rf_gfx_begin(RF_QUADS);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_normal3f(0.0f, 0.0f, 1.0f);

    rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(0.0f, 0.0f);

    rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(0.0f, thick);

    rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(d, thick);

    rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(d, 0.0f);
    rf_gfx_end();
    rf_gfx_pop_matrix();

    rf_gfx_disable_texture();
}